

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

ImFont * __thiscall
ImFontAtlas::AddFontFromMemoryTTF
          (ImFontAtlas *this,void *ttf_data,int ttf_size,float size_pixels,
          ImFontConfig *font_cfg_template,ImWchar *glyph_ranges)

{
  ImFont *pIVar1;
  ImFontConfig local_a8;
  
  if (font_cfg_template == (ImFontConfig *)0x0) {
    local_a8.FontDataOwnedByAtlas = true;
    local_a8.FontNo = 0;
    local_a8.OversampleH = 3;
    local_a8.OversampleV = 1;
    local_a8.PixelSnapH = false;
    local_a8.GlyphRanges = (ImWchar *)0x0;
    local_a8.GlyphExtraSpacing.x = 0.0;
    local_a8.GlyphExtraSpacing.y = 0.0;
    local_a8.GlyphOffset.x = 0.0;
    local_a8.GlyphOffset.y = 0.0;
    local_a8.GlyphMinAdvanceX = 0.0;
    local_a8.GlyphMaxAdvanceX = 3.4028235e+38;
    local_a8.MergeMode = false;
    local_a8.RasterizerFlags = 0;
    local_a8.RasterizerMultiply = 1.0;
    local_a8.Name[0] = '\0';
    local_a8.Name[1] = '\0';
    local_a8.Name[2] = '\0';
    local_a8.Name[3] = '\0';
    local_a8.Name[4] = '\0';
    local_a8.Name[5] = '\0';
    local_a8.Name[6] = '\0';
    local_a8.Name[7] = '\0';
    local_a8.Name[8] = '\0';
    local_a8.Name[9] = '\0';
    local_a8.Name[10] = '\0';
    local_a8.Name[0xb] = '\0';
    local_a8.Name[0xc] = '\0';
    local_a8.Name[0xd] = '\0';
    local_a8.Name[0xe] = '\0';
    local_a8.Name[0xf] = '\0';
    local_a8.Name[0x10] = '\0';
    local_a8.Name[0x11] = '\0';
    local_a8.Name[0x12] = '\0';
    local_a8.Name[0x13] = '\0';
    local_a8.Name[0x14] = '\0';
    local_a8.Name[0x15] = '\0';
    local_a8.Name[0x16] = '\0';
    local_a8.Name[0x17] = '\0';
    local_a8.Name[0x18] = '\0';
    local_a8.Name[0x19] = '\0';
    local_a8.Name[0x1a] = '\0';
    local_a8.Name[0x1b] = '\0';
    local_a8.Name[0x1c] = '\0';
    local_a8.Name[0x1d] = '\0';
    local_a8.Name[0x1e] = '\0';
    local_a8.Name[0x1f] = '\0';
    local_a8.Name[0x20] = '\0';
    local_a8.Name[0x21] = '\0';
    local_a8.Name[0x22] = '\0';
    local_a8.Name[0x23] = '\0';
    local_a8.Name[0x24] = '\0';
    local_a8.Name[0x25] = '\0';
    local_a8.Name[0x26] = '\0';
    local_a8.Name[0x27] = '\0';
    local_a8.DstFont = (ImFont *)0x0;
  }
  else {
    memcpy(&local_a8,font_cfg_template,0x88);
  }
  if (glyph_ranges != (ImWchar *)0x0) {
    local_a8.GlyphRanges = glyph_ranges;
  }
  local_a8.FontData = ttf_data;
  local_a8.FontDataSize = ttf_size;
  local_a8.SizePixels = size_pixels;
  pIVar1 = AddFont(this,&local_a8);
  return pIVar1;
}

Assistant:

ImFont* ImFontAtlas::AddFontFromMemoryTTF(void* ttf_data, int ttf_size, float size_pixels, const ImFontConfig* font_cfg_template, const ImWchar* glyph_ranges)
{
    IM_ASSERT(!Locked && "Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!");
    ImFontConfig font_cfg = font_cfg_template ? *font_cfg_template : ImFontConfig();
    IM_ASSERT(font_cfg.FontData == NULL);
    font_cfg.FontData = ttf_data;
    font_cfg.FontDataSize = ttf_size;
    font_cfg.SizePixels = size_pixels;
    if (glyph_ranges)
        font_cfg.GlyphRanges = glyph_ranges;
    return AddFont(&font_cfg);
}